

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

int64_t CLI::detail::to_flag_value(string *val)

{
  byte bVar1;
  int64_t iVar2;
  int64_t iVar3;
  __type _Var4;
  bool bVar5;
  int iVar6;
  long lVar7;
  invalid_argument *this;
  string local_60;
  string local_40;
  
  if ((to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_),
     iVar6 != 0)) {
    ::std::__cxx11::string::string
              ((string *)&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_,"true",
               (allocator *)&local_60);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_);
  }
  if ((to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_),
     iVar6 != 0)) {
    ::std::__cxx11::string::string
              ((string *)&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_,"false",
               (allocator *)&local_60);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_);
  }
  _Var4 = ::std::operator==(val,&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_);
  iVar2 = 1;
  lVar7 = iVar2;
  if (!_Var4) {
    _Var4 = ::std::operator==(val,&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_);
    iVar3 = -1;
    lVar7 = iVar3;
    if (!_Var4) {
      ::std::__cxx11::string::string((string *)&local_40,(string *)val);
      to_lower(&local_60,&local_40);
      ::std::__cxx11::string::operator=((string *)val,(string *)&local_60);
      ::std::__cxx11::string::~string((string *)&local_60);
      ::std::__cxx11::string::~string((string *)&local_40);
      if (val->_M_string_length == 1) {
        bVar1 = *(val->_M_dataplus)._M_p;
        if ((byte)(bVar1 - 0x31) < 9) {
          lVar7 = (ulong)bVar1 - 0x30;
        }
        else {
          lVar7 = iVar2;
          if ((((((ulong)bVar1 != 0x2b) && (lVar7 = iVar3, bVar1 != 0x2d)) && (bVar1 != 0x30)) &&
              ((bVar1 != 0x66 && (bVar1 != 0x6e)))) &&
             ((lVar7 = iVar2, bVar1 != 0x79 && (bVar1 != 0x74)))) {
            this = (invalid_argument *)__cxa_allocate_exception(0x10);
            ::std::invalid_argument::invalid_argument(this,"unrecognized character");
            __cxa_throw(this,&::std::invalid_argument::typeinfo,
                        ::std::invalid_argument::~invalid_argument);
          }
        }
      }
      else {
        _Var4 = ::std::operator==(val,&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_);
        lVar7 = iVar2;
        if ((((!_Var4) && (bVar5 = ::std::operator==(val,"on"), !bVar5)) &&
            (bVar5 = ::std::operator==(val,"yes"), !bVar5)) &&
           (((bVar5 = ::std::operator==(val,"enable"), !bVar5 &&
             (_Var4 = ::std::operator==(val,&to_flag_value(std::__cxx11::string)::
                                             falseString_abi_cxx11_), lVar7 = iVar3, !_Var4)) &&
            ((bVar5 = ::std::operator==(val,"off"), !bVar5 &&
             ((bVar5 = ::std::operator==(val,"no"), !bVar5 &&
              (bVar5 = ::std::operator==(val,"disable"), !bVar5)))))))) {
          lVar7 = std::__cxx11::stoll(val,(size_t *)0x0,10);
        }
      }
    }
  }
  return lVar7;
}

Assistant:

inline int64_t to_flag_value(std::string val) {
    static const std::string trueString("true");
    static const std::string falseString("false");
    if(val == trueString) {
        return 1;
    }
    if(val == falseString) {
        return -1;
    }
    val = detail::to_lower(val);
    int64_t ret;
    if(val.size() == 1) {
        if(val[0] >= '1' && val[0] <= '9') {
            return (static_cast<int64_t>(val[0]) - '0');
        }
        switch(val[0]) {
        case '0':
        case 'f':
        case 'n':
        case '-':
            ret = -1;
            break;
        case 't':
        case 'y':
        case '+':
            ret = 1;
            break;
        default:
            throw std::invalid_argument("unrecognized character");
        }
        return ret;
    }
    if(val == trueString || val == "on" || val == "yes" || val == "enable") {
        ret = 1;
    } else if(val == falseString || val == "off" || val == "no" || val == "disable") {
        ret = -1;
    } else {
        ret = std::stoll(val);
    }
    return ret;
}